

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# devices.cc
# Opt level: O0

void __thiscall cnn::Device_CPU::Device_CPU(Device_CPU *this,int mb,bool shared)

{
  void *pvVar1;
  undefined8 uVar2;
  AlignedMemoryPool *this_00;
  MemAllocator *a;
  void *pvVar3;
  byte in_DL;
  undefined8 *in_RDI;
  size_t byte_count;
  undefined8 in_stack_ffffffffffffff88;
  Device *in_stack_ffffffffffffff90;
  
  *in_RDI = &PTR__Device_CPU_00945dc8;
  Device::Device(in_stack_ffffffffffffff90,(DeviceType)((ulong)in_stack_ffffffffffffff88 >> 0x20),
                 (MemAllocator *)0x5f2a15);
  *in_RDI = &PTR__Device_CPU_00945dc8;
  CPUAllocator::CPUAllocator((CPUAllocator *)in_stack_ffffffffffffff90);
  in_RDI[0xf] = in_RDI[2];
  if ((in_DL & 1) != 0) {
    pvVar1 = operator_new(0x10);
    SharedAllocator::SharedAllocator((SharedAllocator *)in_stack_ffffffffffffff90);
    in_RDI[0xf] = pvVar1;
  }
  uVar2 = (**(code **)(*(long *)in_RDI[2] + 0x10))((long *)in_RDI[2],4);
  in_RDI[6] = uVar2;
  *(undefined4 *)in_RDI[6] = 0xbf800000;
  uVar2 = (**(code **)(*(long *)in_RDI[2] + 0x10))((long *)in_RDI[2],4);
  in_RDI[7] = uVar2;
  *(undefined4 *)in_RDI[7] = 0x3f800000;
  this_00 = (AlignedMemoryPool *)(**(code **)(*(long *)in_RDI[2] + 0x10))((long *)in_RDI[2],4);
  in_RDI[8] = this_00;
  *(undefined4 *)in_RDI[8] = 0;
  pvVar1 = operator_new(0x28);
  AlignedMemoryPool::AlignedMemoryPool
            (this_00,(size_t)pvVar1,(MemAllocator *)in_stack_ffffffffffffff90);
  in_RDI[3] = pvVar1;
  a = (MemAllocator *)operator_new(0x28);
  AlignedMemoryPool::AlignedMemoryPool(this_00,(size_t)pvVar1,a);
  in_RDI[4] = a;
  pvVar3 = operator_new(0x28);
  AlignedMemoryPool::AlignedMemoryPool(this_00,(size_t)pvVar1,a);
  in_RDI[5] = pvVar3;
  return;
}

Assistant:

Device_CPU::Device_CPU(int mb, bool shared) :
    Device(DeviceType::CPU, &cpu_mem), shmem(mem) {
  if (shared) shmem = new SharedAllocator();
  kSCALAR_MINUSONE = (float*) mem->malloc(sizeof(float));
  *kSCALAR_MINUSONE = -1;
  kSCALAR_ONE = (float*) mem->malloc(sizeof(float));
  *kSCALAR_ONE = 1;
  kSCALAR_ZERO = (float*) mem->malloc(sizeof(float));
  *kSCALAR_ZERO = 0;

  // this is the big memory allocation: the pools
        
  size_t byte_count = (size_t)mb << 20;
  fxs = new AlignedMemoryPool(byte_count, mem); // memory for node values
  dEdfs = new AlignedMemoryPool(byte_count, mem); // memory for node gradients
  ps = new AlignedMemoryPool(byte_count, mem); // memory for parameters

}